

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

int send_sasl_header(SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance_local;
  
  iVar1 = xio_send(sasl_client_io_instance->underlying_io,"AMQP\x03\x01",8,
                   unchecked_on_send_complete,(void *)0x0);
  if (iVar1 == 0) {
    if (((sasl_client_io_instance->field_0x78 & 1) != 0) &&
       (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
      (*p_Var2)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"send_sasl_header",0xb0,1,"-> Header (AMQP 3.1.0.0)");
    }
    l._4_4_ = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"send_sasl_header",0xa9,1,"Sending SASL header failed");
    }
    l._4_4_ = 0xaa;
  }
  return l._4_4_;
}

Assistant:

static int send_sasl_header(SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance)
{
    int result;

    /* Codes_SRS_SASLCLIENTIO_01_078: [SASL client IO shall start the header exchange by sending the SASL header.] */
    /* Codes_SRS_SASLCLIENTIO_01_095: [Sending the header shall be done by using `xio_send`.]*/
    if (xio_send(sasl_client_io_instance->underlying_io, sasl_header, sizeof(sasl_header), unchecked_on_send_complete, NULL) != 0)
    {
        LogError("Sending SASL header failed");
        result = MU_FAILURE;
    }
    else
    {
        if (sasl_client_io_instance->is_trace_on != 0)
        {
            LOG(AZ_LOG_TRACE, LOG_LINE, "-> Header (AMQP 3.1.0.0)");
        }

        result = 0;
    }

    return result;
}